

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall Am_Object::Text_Inspect(Am_Object *this,Am_Slot_Key key)

{
  Am_Object_Data *pAVar1;
  ostream *poVar2;
  Am_Slot_Data *slot;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nFor Object ",0xc);
  pAVar1 = this->data;
  if (pAVar1 == (Am_Object_Data *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(0L) Object",0xb);
  }
  else {
    (*(pAVar1->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[2])
              (pAVar1,&std::cout);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
  poVar2 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  if (this->data == (Am_Object_Data *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  ** Object is not Valid\n",0x19);
  }
  else {
    slot = Am_Object_Data::find_slot(this->data,key);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Slot ",7);
    Am_Object_Data::print_slot_name_and_value(this->data,key,slot);
  }
  std::ostream::flush();
  return;
}

Assistant:

void
Am_Object::Text_Inspect(Am_Slot_Key key) const
{
  std::cout << "\nFor Object " << *this << " (" << (void *)data << ")\n";
  if (data) {
    Am_Slot_Data *slot = data->find_slot(key);
    std::cout << "  Slot ";
    data->print_slot_name_and_value(key, slot);
  } else
    std::cout << "  ** Object is not Valid\n";
  std::cout << std::flush;
}